

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void in_or_out_of_sub_groups
               (Am_Value_List *sub_groups,Am_Object *group,bool into_sub_group,bool recalc)

{
  bool bVar1;
  int left_offset;
  Am_Value *pAVar2;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Value_List local_e0;
  Am_Value_List local_d0;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Value_List local_a8;
  Am_Value_List local_98;
  Am_Object local_88;
  Am_Object local_80;
  Am_Value_List local_78;
  Am_Value_List local_68;
  Am_Object sub_group;
  int top;
  int left;
  undefined1 local_40 [8];
  Am_Value_List dummy_list;
  Am_Value_List sub_group_parts;
  bool recalc_local;
  bool into_sub_group_local;
  Am_Object *group_local;
  Am_Value_List *sub_groups_local;
  
  Am_Value_List::Am_Value_List((Am_Value_List *)&dummy_list.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_40);
  Am_Object::Am_Object((Am_Object *)&local_68.item);
  Am_Value_List::Start(sub_groups);
  while (bVar1 = Am_Value_List::Last(sub_groups), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar2 = Am_Value_List::Get(sub_groups);
    Am_Object::operator=((Am_Object *)&local_68.item,pAVar2);
    pAVar2 = Am_Object::Get((Am_Object *)&local_68.item,100,0);
    left_offset = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get((Am_Object *)&local_68.item,0x65,0);
    sub_group.data._4_4_ = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get((Am_Object *)&local_68.item,0x1e4,0);
    Am_Value_List::operator=((Am_Value_List *)&dummy_list.item,pAVar2);
    if (into_sub_group) {
      if (recalc) {
        Am_Value_List::Am_Value_List(&local_78,(Am_Value_List *)&dummy_list.item);
        Am_Object::Am_Object(&local_80,group);
        Am_Object::Am_Object(&local_88,(Am_Object *)&local_68.item);
        put_objects_into_group(&local_68,&local_78,(Am_Object *)local_40,&local_80);
        Am_Object::~Am_Object((Am_Object *)&local_68);
        Am_Object::~Am_Object(&local_88);
        Am_Object::~Am_Object(&local_80);
        Am_Value_List::~Am_Value_List(&local_78);
      }
      else {
        Am_Value_List::Am_Value_List(&local_98,(Am_Value_List *)&dummy_list.item);
        adjust_objects_positions(&local_98,-left_offset,-sub_group.data._4_4_);
        Am_Value_List::~Am_Value_List(&local_98);
        Am_Value_List::Am_Value_List(&local_a8,(Am_Value_List *)&dummy_list.item);
        Am_Object::Am_Object(&local_b0,group);
        Am_Object::Am_Object(&local_b8,(Am_Object *)&local_68.item);
        Am_Object::Am_Object(&local_c0,&Am_No_Object);
        remove_and_add_objects(&local_a8,&local_b0,&local_b8,&local_c0);
        Am_Object::~Am_Object(&local_c0);
        Am_Object::~Am_Object(&local_b8);
        Am_Object::~Am_Object(&local_b0);
        Am_Value_List::~Am_Value_List(&local_a8);
      }
    }
    else {
      Am_Value_List::Am_Value_List(&local_d0,(Am_Value_List *)&dummy_list.item);
      adjust_objects_positions(&local_d0,left_offset,sub_group.data._4_4_);
      Am_Value_List::~Am_Value_List(&local_d0);
      Am_Value_List::Am_Value_List(&local_e0,(Am_Value_List *)&dummy_list.item);
      Am_Object::Am_Object(&local_e8,(Am_Object *)&local_68.item);
      Am_Object::Am_Object(&local_f0,group);
      Am_Object::Am_Object(&local_f8,&Am_No_Object);
      remove_and_add_objects(&local_e0,&local_e8,&local_f0,&local_f8);
      Am_Object::~Am_Object(&local_f8);
      Am_Object::~Am_Object(&local_f0);
      Am_Object::~Am_Object(&local_e8);
      Am_Value_List::~Am_Value_List(&local_e0);
    }
    Am_Value_List::Next(sub_groups);
  }
  Am_Object::~Am_Object((Am_Object *)&local_68.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_40);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&dummy_list.item);
  return;
}

Assistant:

void
in_or_out_of_sub_groups(Am_Value_List sub_groups, Am_Object group,
                        bool into_sub_group, bool recalc)
{
  Am_Value_List sub_group_parts, dummy_list;
  int left, top;
  Am_Object sub_group;
  for (sub_groups.Start(); !sub_groups.Last(); sub_groups.Next()) {
    sub_group = sub_groups.Get();
    left = sub_group.Get(Am_LEFT);
    top = sub_group.Get(Am_TOP);
    sub_group_parts = sub_group.Get(Am_OBJECT_MODIFIED_PLACES);
    if (into_sub_group) {
      if (recalc)
        put_objects_into_group(sub_group_parts, dummy_list, group, sub_group);
      else {
        adjust_objects_positions(sub_group_parts, -left, -top);
        remove_and_add_objects(sub_group_parts, group, sub_group);
      }
    } else {
      adjust_objects_positions(sub_group_parts, left, top);
      remove_and_add_objects(sub_group_parts, sub_group, group);
    }
  }
}